

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLLinOp.cpp
# Opt level: O0

Any __thiscall amrex::MLLinOp::AnyMakeCoarseAmr(MLLinOp *this,int famrlev,IntVect *ng)

{
  int i;
  undefined4 uVar1;
  MFInfo *info;
  MultiFab *in_RCX;
  BoxArray *in_RSI;
  DistributionMapping *in_RDI;
  IntVect ratio;
  BoxArray cba;
  BoxArray *in_stack_fffffffffffffd48;
  MLLinOp *in_stack_fffffffffffffd50;
  BoxArray *pBVar2;
  IntVect *in_stack_fffffffffffffd58;
  BoxArray *in_stack_fffffffffffffd60;
  Any *this_00;
  undefined4 in_stack_fffffffffffffd70;
  int ncomp;
  _Head_base<0UL,_amrex::Any::innards_base_*,_false> dm;
  MultiFab *this_01;
  FabFactory<amrex::FArrayBox> *factory;
  Any local_258 [56];
  undefined1 local_94 [116];
  MultiFab *local_20;
  
  dm._M_head_impl = (innards_base *)in_RDI;
  local_20 = in_RCX;
  Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
  ::operator[]((Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                *)in_stack_fffffffffffffd50,(size_type)in_stack_fffffffffffffd48);
  ncomp = (int)((ulong)in_RDI >> 0x20);
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
            ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)in_stack_fffffffffffffd50,
             (size_type)in_stack_fffffffffffffd48);
  this_01 = (MultiFab *)(local_94 + 0xc);
  BoxArray::BoxArray((BoxArray *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  i = AMRRefRatio(in_stack_fffffffffffffd50,(int)((ulong)in_stack_fffffffffffffd48 >> 0x20));
  pBVar2 = (BoxArray *)local_94;
  IntVect::IntVect((IntVect *)pBVar2,i);
  BoxArray::coarsen(pBVar2,(IntVect *)this_01);
  BoxArray::convert(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
  Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
  ::operator[]((Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                *)in_stack_fffffffffffffd50,(size_type)in_stack_fffffffffffffd48);
  info = (MFInfo *)
         Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::operator[]
                   ((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                     *)in_stack_fffffffffffffd50,(size_type)in_stack_fffffffffffffd48);
  uVar1 = (**(code **)(*(long *)&in_RSI->m_bat + 0x28))();
  local_258[2].m_ptr._M_t.
  super___uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>.
  _M_t.
  super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
  .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>._M_head_impl =
       (unique_ptr<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>)
       (__uniq_ptr_data<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>,_true,_true>
        )0x0;
  local_258[3].m_ptr._M_t.
  super___uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>.
  _M_t.
  super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
  .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>._M_head_impl =
       (unique_ptr<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>)
       (__uniq_ptr_data<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>,_true,_true>
        )0x0;
  local_258[0].m_ptr._M_t.
  super___uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>.
  _M_t.
  super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
  .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>._M_head_impl =
       (unique_ptr<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>)
       (__uniq_ptr_data<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>,_true,_true>
        )0x0;
  local_258[1].m_ptr._M_t.
  super___uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>.
  _M_t.
  super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
  .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>._M_head_impl =
       (unique_ptr<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>)
       (__uniq_ptr_data<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>,_true,_true>
        )0x0;
  local_258[4].m_ptr._M_t.
  super___uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>.
  _M_t.
  super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
  .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>._M_head_impl =
       (unique_ptr<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>)
       (__uniq_ptr_data<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>,_true,_true>
        )0x0;
  this_00 = local_258;
  MFInfo::MFInfo((MFInfo *)0x150cbb8);
  factory = (FabFactory<amrex::FArrayBox> *)0x0;
  pBVar2 = (BoxArray *)&stack0xfffffffffffffda0;
  DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
            ((DefaultFabFactory<amrex::FArrayBox> *)pBVar2);
  MultiFab::MultiFab(this_01,in_RSI,(DistributionMapping *)dm._M_head_impl,ncomp,
                     (IntVect *)CONCAT44(uVar1,in_stack_fffffffffffffd70),info,factory);
  Any::Any<amrex::MultiFab>(this_00,local_20);
  MultiFab::~MultiFab((MultiFab *)0x150cc26);
  DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
            ((DefaultFabFactory<amrex::FArrayBox> *)0x150cc30);
  MFInfo::~MFInfo((MFInfo *)0x150cc3a);
  BoxArray::~BoxArray(pBVar2);
  return (unique_ptr<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>)
         (unique_ptr<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>)
         dm._M_head_impl;
}

Assistant:

Any
MLLinOp::AnyMakeCoarseAmr (int famrlev, IntVect const& ng) const
{
    BoxArray cba = m_grids[famrlev][0];
    IntVect ratio(AMRRefRatio(famrlev-1));
    cba.coarsen(ratio);
    cba.convert(m_ixtype);
    return Any(MultiFab(cba, m_dmap[famrlev][0], getNComp(), ng));
}